

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * Catch::
         StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
         ::convert(string *__return_storage_ptr__,string *str)

{
  size_type sVar1;
  pointer pcVar2;
  long lVar3;
  char cVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_type *psVar7;
  size_type sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (IMutableContext::currentContext == (long *)0x0) {
    IMutableContext::currentContext = (long *)operator_new(0x30);
    *IMutableContext::currentContext = 0;
    IMutableContext::currentContext[1] = 0;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
    *IMutableContext::currentContext = (long)&PTR__Context_001cf690;
    IMutableContext::currentContext[1] = (long)&PTR__Context_001cf6e0;
  }
  puVar5 = (undefined8 *)(**(code **)(*IMutableContext::currentContext + 0x20))();
  cVar4 = (**(code **)(*(long *)*puVar5 + 0x50))();
  if (cVar4 == '\0') {
    std::operator+(&local_50,'\"',str);
    plVar6 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_50,local_50._M_string_length,0,'\x01');
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar7) {
      lVar3 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"","");
    sVar1 = str->_M_string_length;
    if (sVar1 != 0) {
      pcVar2 = (str->_M_dataplus)._M_p;
      sVar8 = 0;
      do {
        cVar4 = pcVar2[sVar8];
        if ((cVar4 == '\t') || (cVar4 == '\n')) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        sVar8 = sVar8 + 1;
      } while (sVar1 != sVar8);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<std::string>::convert(const std::string& str) {
    if (!getCurrentContext().getConfig()->showInvisibles()) {
        return '"' + str + '"';
    }

    std::string s("\"");
    for (char c : str) {
        switch (c) {
        case '\n':
            s.append("\\n");
            break;
        case '\t':
            s.append("\\t");
            break;
        default:
            s.push_back(c);
            break;
        }
    }
    s.append("\"");
    return s;
}